

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
anurbs::NurbsSurfaceGeometry<2L>::nonzero_pole_indices_at_span
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,
          NurbsSurfaceGeometry<2L> *this,Index span_u,Index span_v)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  Index j;
  long lVar3;
  long lVar4;
  pointer plVar5;
  long lVar6;
  allocator_type local_41;
  vector<long,_std::allocator<long>_> *local_40;
  long local_38;
  
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,
             (CONCAT44(extraout_var_00,iVar2) + 1) * (CONCAT44(extraout_var,iVar1) + 1),&local_41);
  local_40 = __return_storage_ptr__;
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  iVar2 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  plVar5 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = span_u - CONCAT44(extraout_var_01,iVar1);
  lVar4 = 0;
  while( true ) {
    lVar6 = lVar6 + 1;
    iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
    if (CONCAT44(extraout_var_03,iVar1) < lVar4) break;
    lVar3 = 0;
    local_38 = lVar4;
    while( true ) {
      iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
      if (CONCAT44(extraout_var_04,iVar1) < lVar3) break;
      (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
      lVar4 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
      *plVar5 = ((lVar4 - CONCAT44(extraout_var_05,iVar1)) + 1) * lVar6 +
                (span_v - CONCAT44(extraout_var_02,iVar2)) + 1 + lVar3;
      plVar5 = plVar5 + 1;
      lVar3 = lVar3 + 1;
    }
    lVar4 = local_38 + 1;
  }
  return local_40;
}

Assistant:

std::vector<Index> nonzero_pole_indices_at_span(const Index span_u, const Index span_v) const
    {
        std::vector<Index> indices((degree_u() + 1) * (degree_v() + 1));

        const Index first_nonzero_pole_index_u = span_u - degree_u() + 1;
        const Index first_nonzero_pole_index_v = span_v - degree_v() + 1;

        auto it = indices.begin();

        for (Index i = 0; i < degree_u() + 1; i++) {
            for (Index j = 0; j < degree_v() + 1; j++) {
                *(it++) = to_single_index(first_nonzero_pole_index_u + i, first_nonzero_pole_index_v + j);
            }
        }

        return indices;
    }